

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glu.cpp
# Opt level: O0

int __thiscall ncnn::GLU::forward(GLU *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  float fVar1;
  float sigmoid_5;
  int x_2;
  int y_1;
  float *out_ptr_5;
  float *in_ptr_5;
  int q_2;
  int out_c_2;
  int out_h_4;
  int out_w_5;
  int c_2;
  int h_4;
  int w_5;
  float sigmoid_4;
  int i_2;
  float *out_ptr_4;
  float *in_ptr_4;
  int q_1;
  int size_2;
  int offset_2;
  int out_c_1;
  int out_h_3;
  int out_w_4;
  int c_1;
  int h_3;
  int w_4;
  float sigmoid_3;
  int i_1;
  float *out_ptr_3;
  float *in_ptr_3;
  int q;
  int size_1;
  int offset_1;
  int out_c;
  int out_h_2;
  int out_w_3;
  int c;
  int h_2;
  int w_3;
  float sigmoid_2;
  int x_1;
  float *out_ptr_2;
  float *in_ptr_2;
  int y;
  int out_h_1;
  int out_w_2;
  int h_1;
  int w_2;
  float sigmoid_1;
  int i;
  float *out_ptr_1;
  float *in_ptr_1;
  int size;
  int offset;
  int out_h;
  int out_w_1;
  int h;
  int w_1;
  float sigmoid;
  int x;
  float *out_ptr;
  float *in_ptr;
  int out_w;
  int w;
  int positive_axis;
  int dims;
  Mat *m_4;
  Mat *m_2;
  Mat *m;
  Mat *m_5;
  Mat *m_3;
  Mat *m_1;
  Allocator *in_stack_fffffffffffff6e8;
  Allocator *in_stack_fffffffffffff6f0;
  size_t in_stack_fffffffffffff6f8;
  int iVar2;
  Mat *in_stack_fffffffffffff700;
  int _h;
  undefined8 in_stack_fffffffffffff708;
  int _w;
  Mat *in_stack_fffffffffffff710;
  int local_82c;
  int local_818;
  int local_814;
  undefined8 local_810;
  undefined8 local_808;
  undefined8 local_800;
  undefined4 local_7f8;
  long local_7f0;
  undefined4 local_7e8;
  undefined4 local_7e4;
  undefined4 local_7e0;
  undefined4 local_7dc;
  undefined4 local_7d8;
  undefined8 local_7d0;
  long local_7c8;
  undefined8 local_7c0;
  undefined8 local_7b8;
  undefined8 local_7b0;
  undefined4 local_7a8;
  long local_7a0;
  undefined4 local_798;
  undefined4 local_794;
  undefined4 local_790;
  undefined4 local_78c;
  undefined4 local_788;
  undefined8 local_780;
  long local_778;
  int local_76c;
  int local_768;
  int local_764;
  int local_760;
  int local_75c;
  int local_758;
  int local_754;
  float local_750;
  int local_74c;
  undefined8 local_748;
  undefined8 local_740;
  undefined8 local_738;
  undefined4 local_730;
  long local_728;
  undefined4 local_720;
  undefined4 local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined4 local_710;
  undefined8 local_708;
  long local_700;
  undefined8 local_6f8;
  undefined8 local_6f0;
  undefined8 local_6e8;
  undefined4 local_6e0;
  long local_6d8;
  undefined4 local_6d0;
  undefined4 local_6cc;
  undefined4 local_6c8;
  undefined4 local_6c4;
  undefined4 local_6c0;
  undefined8 local_6b8;
  long local_6b0;
  int local_6a4;
  int local_6a0;
  int local_69c;
  int local_698;
  int local_694;
  int local_690;
  int local_68c;
  int local_688;
  int local_684;
  float local_680;
  int local_67c;
  undefined8 local_678;
  undefined8 local_670;
  undefined8 local_668;
  undefined4 local_660;
  long local_658;
  undefined4 local_650;
  undefined4 local_64c;
  undefined4 local_648;
  undefined4 local_644;
  undefined4 local_640;
  undefined8 local_638;
  long local_630;
  undefined8 local_618;
  undefined8 local_610;
  undefined8 local_608;
  undefined4 local_600;
  long local_5f8;
  undefined4 local_5f0;
  undefined4 local_5ec;
  undefined4 local_5e8;
  undefined4 local_5e4;
  undefined4 local_5e0;
  undefined8 local_5d8;
  long local_5d0;
  int local_5c4;
  int local_5c0;
  int local_5bc;
  int local_5b8;
  int local_5b4;
  int local_5b0;
  int local_5ac;
  int local_5a8;
  int local_5a4;
  float local_5a0;
  int local_59c;
  long local_598;
  long local_590;
  int local_584;
  int local_580;
  int local_57c;
  int local_578;
  int local_574;
  float local_570;
  int local_56c;
  long local_568;
  long local_560;
  int local_558;
  int local_554;
  int local_550;
  int local_54c;
  int local_548;
  int local_544;
  float local_540;
  int local_53c;
  long local_538;
  long local_530;
  int local_528;
  int local_524;
  int local_520;
  int local_51c;
  long *local_510;
  long *local_508;
  int local_4f4;
  undefined8 *local_4f0;
  undefined8 *local_4e8;
  undefined8 *local_4e0;
  long *local_4d8;
  long *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  long *local_4b0;
  long *local_4a8;
  int local_49c;
  long *local_498;
  int local_48c;
  long *local_488;
  undefined1 local_47d;
  int local_47c;
  undefined8 *local_470;
  undefined1 local_465;
  int local_464;
  undefined8 *local_458;
  undefined1 local_44d;
  int local_44c;
  undefined8 *local_440;
  undefined8 *local_420;
  undefined8 *local_410;
  undefined8 *local_400;
  undefined8 *local_3f0;
  undefined8 *local_3e0;
  undefined8 *local_3d0;
  undefined1 local_3bd;
  int local_3bc;
  undefined8 *local_3b0;
  undefined1 local_39d;
  int local_39c;
  undefined8 *local_390;
  undefined1 local_37d;
  int local_37c;
  undefined8 *local_370;
  long local_360;
  undefined4 local_354;
  long local_350;
  long local_348;
  undefined4 local_33c;
  int local_338;
  int local_334;
  undefined8 *local_330;
  long local_328;
  undefined4 local_31c;
  long local_318;
  long local_310;
  undefined4 local_304;
  int local_300;
  int local_2fc;
  undefined8 *local_2f8;
  long local_2f0;
  undefined4 local_2e4;
  long local_2e0;
  long local_2d8;
  undefined4 local_2cc;
  int local_2c8;
  int local_2c4;
  undefined8 *local_2c0;
  long local_2b8;
  undefined4 local_2ac;
  long local_2a8;
  long local_2a0;
  undefined4 local_294;
  int local_290;
  int local_28c;
  undefined8 *local_288;
  long local_280;
  undefined4 local_274;
  long local_270;
  long local_268;
  undefined4 local_25c;
  int local_258;
  int local_254;
  undefined8 *local_250;
  long local_248;
  undefined4 local_23c;
  long local_238;
  long local_230;
  undefined4 local_224;
  int local_220;
  int local_21c;
  undefined8 *local_218;
  undefined4 local_20c;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  undefined4 local_1ec;
  long local_1e8;
  undefined4 local_1dc;
  long local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  undefined8 *local_168;
  undefined8 *local_148;
  undefined8 *local_128;
  undefined8 *local_108;
  undefined8 *local_e8;
  undefined8 *local_c8;
  
  local_51c = (int)in_RSI[5];
  if (*(int *)(in_RDI + 0xd0) < 0) {
    local_82c = local_51c + *(int *)(in_RDI + 0xd0);
  }
  else {
    local_82c = *(int *)(in_RDI + 0xd0);
  }
  local_520 = local_82c;
  iVar2 = (int)(in_stack_fffffffffffff6f8 >> 0x20);
  local_510 = in_RDX;
  local_508 = in_RSI;
  if (local_51c == 1) {
    local_524 = *(int *)((long)in_RSI + 0x2c);
    local_528 = local_524 / 2;
    Mat::create(in_stack_fffffffffffff700,iVar2,(size_t)in_stack_fffffffffffff6f0,
                in_stack_fffffffffffff6e8);
    local_4d0 = local_508;
    local_530 = *local_508;
    local_4a8 = local_510;
    local_538 = *local_510;
    for (local_53c = 0; local_53c < local_528; local_53c = local_53c + 1) {
      fVar1 = expf(-*(float *)(local_530 + (long)(local_53c + local_528) * 4));
      local_540 = 1.0 / (fVar1 + 1.0);
      *(float *)(local_538 + (long)local_53c * 4) =
           *(float *)(local_530 + (long)local_53c * 4) * local_540;
    }
    local_4f4 = 0;
  }
  else if ((local_51c == 2) && (local_82c == 0)) {
    local_54c = *(int *)((long)in_RSI + 0x2c);
    local_548 = (int)in_RSI[6];
    local_550 = local_548 / 2;
    local_544 = local_54c;
    Mat::create(in_stack_fffffffffffff700,iVar2,(int)in_stack_fffffffffffff6f8,
                (size_t)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
    local_558 = local_54c * local_550;
    local_4d8 = local_508;
    local_560 = *local_508;
    local_4b0 = local_510;
    local_568 = *local_510;
    local_554 = local_558;
    for (local_56c = 0; local_56c < local_558; local_56c = local_56c + 1) {
      fVar1 = expf(-*(float *)(local_560 + (long)(local_56c + local_554) * 4));
      local_570 = 1.0 / (fVar1 + 1.0);
      *(float *)(local_568 + (long)local_56c * 4) =
           *(float *)(local_560 + (long)local_56c * 4) * local_570;
    }
    local_4f4 = 0;
  }
  else if ((local_51c == 2) && (local_82c == 1)) {
    local_574 = *(int *)((long)in_RSI + 0x2c);
    local_580 = (int)in_RSI[6];
    local_57c = local_574 / 2;
    local_578 = local_580;
    Mat::create(in_stack_fffffffffffff700,iVar2,(int)in_stack_fffffffffffff6f8,
                (size_t)in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
    for (local_584 = 0; local_584 < local_578; local_584 = local_584 + 1) {
      local_498 = local_508;
      local_49c = local_584;
      local_590 = *local_508 +
                  (long)*(int *)((long)local_508 + 0x2c) * (long)local_584 * local_508[2];
      local_488 = local_510;
      local_48c = local_584;
      local_598 = *local_510 +
                  (long)*(int *)((long)local_510 + 0x2c) * (long)local_584 * local_510[2];
      for (local_59c = 0; local_59c < local_57c; local_59c = local_59c + 1) {
        fVar1 = expf(-*(float *)(local_590 + (long)(local_59c + local_57c) * 4));
        local_5a0 = 1.0 / (fVar1 + 1.0);
        *(float *)(local_598 + (long)local_59c * 4) =
             *(float *)(local_590 + (long)local_59c * 4) * local_5a0;
      }
    }
    local_4f4 = 0;
  }
  else {
    iVar2 = (int)((ulong)in_stack_fffffffffffff700 >> 0x20);
    _h = (int)in_stack_fffffffffffff708;
    _w = (int)((ulong)in_stack_fffffffffffff708 >> 0x20);
    if ((local_51c == 3) && (local_82c == 0)) {
      local_5b0 = *(int *)((long)in_RSI + 0x2c);
      local_5b4 = (int)in_RSI[6];
      local_5ac = (int)in_RSI[7];
      local_5b8 = local_5ac / 2;
      local_5a8 = local_5b4;
      local_5a4 = local_5b0;
      Mat::create(in_stack_fffffffffffff710,_w,_h,iVar2,in_stack_fffffffffffff6f8,
                  in_stack_fffffffffffff6f0);
      local_5bc = local_5b8 * (int)local_508[8];
      local_5c0 = local_5a4 * local_5a8;
      for (local_5c4 = 0; local_5c4 < local_5b8; local_5c4 = local_5c4 + 1) {
        local_440 = &local_618;
        local_28c = *(int *)((long)local_508 + 0x2c);
        local_290 = (int)local_508[6];
        local_294 = *(undefined4 *)((long)local_508 + 0x34);
        local_5d0 = *local_508 + local_508[8] * (long)local_5c4 * local_508[2];
        local_2a8 = local_508[2];
        local_2ac = (undefined4)local_508[3];
        local_2b8 = local_508[4];
        local_288 = &local_618;
        local_1e8 = (long)local_28c * (long)local_290 * local_2a8;
        local_4e0 = &local_618;
        local_420 = &local_618;
        local_1ec = 0x10;
        local_44c = local_5c4;
        local_44d = 1;
        local_370 = &local_678;
        local_334 = *(int *)((long)local_510 + 0x2c);
        local_338 = (int)local_510[6];
        local_33c = *(undefined4 *)((long)local_510 + 0x34);
        local_630 = *local_510 + local_510[8] * (long)local_5c4 * local_510[2];
        local_350 = local_510[2];
        local_354 = (undefined4)local_510[3];
        local_360 = local_510[4];
        local_330 = &local_678;
        local_1b8 = (long)local_334 * (long)local_338 * local_350;
        local_4b8 = &local_678;
        local_410 = &local_678;
        local_5e0 = 0;
        local_5e4 = 0;
        local_5e8 = 0;
        local_5ec = 0;
        local_600 = 0;
        local_608 = 0;
        local_610 = 0;
        local_618 = 0;
        local_1bc = 0x10;
        local_37c = local_5c4;
        local_37d = 1;
        local_5d8 = 0;
        local_5f0 = 0;
        local_678 = 0;
        local_668 = 0;
        local_660 = 0;
        local_650 = 0;
        local_64c = 0;
        local_648 = 0;
        local_644 = 0;
        local_640 = 0;
        local_638 = 0;
        local_670 = 0;
        local_348 = local_630;
        local_2a0 = local_5d0;
        local_e8 = local_410;
        local_c8 = local_420;
        local_658 = local_360;
        local_5f8 = local_2b8;
        for (local_67c = 0; local_67c < local_5c0; local_67c = local_67c + 1) {
          fVar1 = expf(-*(float *)(local_5d0 + (long)(local_67c + local_5bc) * 4));
          local_680 = 1.0 / (fVar1 + 1.0);
          *(float *)(local_630 + (long)local_67c * 4) =
               *(float *)(local_5d0 + (long)local_67c * 4) * local_680;
        }
      }
      local_4f4 = 0;
    }
    else if ((local_51c == 3) && (local_82c == 1)) {
      local_690 = *(int *)((long)in_RSI + 0x2c);
      local_688 = (int)in_RSI[6];
      local_698 = (int)in_RSI[7];
      local_694 = local_688 / 2;
      local_68c = local_698;
      local_684 = local_690;
      Mat::create(in_stack_fffffffffffff710,_w,_h,iVar2,in_stack_fffffffffffff6f8,
                  in_stack_fffffffffffff6f0);
      local_6a0 = local_694 * local_690;
      local_69c = local_6a0;
      for (local_6a4 = 0; local_6a4 < local_68c; local_6a4 = local_6a4 + 1) {
        local_458 = &local_6f8;
        local_254 = *(int *)((long)local_508 + 0x2c);
        local_258 = (int)local_508[6];
        local_25c = *(undefined4 *)((long)local_508 + 0x34);
        local_6b0 = *local_508 + local_508[8] * (long)local_6a4 * local_508[2];
        local_270 = local_508[2];
        local_274 = (undefined4)local_508[3];
        local_280 = local_508[4];
        local_250 = &local_6f8;
        local_1f8 = (long)local_254 * (long)local_258 * local_270;
        local_4e8 = &local_6f8;
        local_400 = &local_6f8;
        local_390 = &local_748;
        local_2fc = *(int *)((long)local_510 + 0x2c);
        local_300 = (int)local_510[6];
        local_304 = *(undefined4 *)((long)local_510 + 0x34);
        local_700 = *local_510 + local_510[8] * (long)local_6a4 * local_510[2];
        local_318 = local_510[2];
        local_31c = (undefined4)local_510[3];
        local_328 = local_510[4];
        local_2f8 = &local_748;
        local_1c8 = (long)local_2fc * (long)local_300 * local_318;
        local_4c0 = &local_748;
        local_3f0 = &local_748;
        local_6c0 = 0;
        local_6c4 = 0;
        local_6c8 = 0;
        local_6cc = 0;
        local_6e0 = 0;
        local_6e8 = 0;
        local_6f0 = 0;
        local_6f8 = 0;
        local_1cc = 0x10;
        local_1fc = 0x10;
        local_39c = local_6a4;
        local_39d = 1;
        local_464 = local_6a4;
        local_465 = 1;
        local_6b8 = 0;
        local_6d0 = 0;
        local_748 = 0;
        local_738 = 0;
        local_730 = 0;
        local_720 = 0;
        local_71c = 0;
        local_718 = 0;
        local_714 = 0;
        local_710 = 0;
        local_708 = 0;
        local_740 = 0;
        local_310 = local_700;
        local_268 = local_6b0;
        local_128 = local_3f0;
        local_108 = local_400;
        local_728 = local_328;
        local_6d8 = local_280;
        for (local_74c = 0; local_74c < local_6a0; local_74c = local_74c + 1) {
          fVar1 = expf(-*(float *)(local_6b0 + (long)(local_74c + local_69c) * 4));
          local_750 = 1.0 / (fVar1 + 1.0);
          *(float *)(local_700 + (long)local_74c * 4) =
               *(float *)(local_6b0 + (long)local_74c * 4) * local_750;
        }
      }
      local_4f4 = 0;
    }
    else if ((local_51c == 3) && (local_82c == 2)) {
      local_754 = *(int *)((long)in_RSI + 0x2c);
      local_764 = (int)in_RSI[6];
      local_768 = (int)in_RSI[7];
      local_760 = local_754 / 2;
      local_75c = local_768;
      local_758 = local_764;
      Mat::create(in_stack_fffffffffffff710,_w,_h,iVar2,in_stack_fffffffffffff6f8,
                  in_stack_fffffffffffff6f0);
      for (local_76c = 0; local_76c < local_75c; local_76c = local_76c + 1) {
        local_470 = &local_7c0;
        local_21c = *(int *)((long)local_508 + 0x2c);
        local_220 = (int)local_508[6];
        local_224 = *(undefined4 *)((long)local_508 + 0x34);
        local_778 = *local_508 + local_508[8] * (long)local_76c * local_508[2];
        local_238 = local_508[2];
        local_23c = (undefined4)local_508[3];
        local_248 = local_508[4];
        local_218 = &local_7c0;
        local_208 = (long)local_21c * (long)local_220 * local_238;
        local_4f0 = &local_7c0;
        local_3e0 = &local_7c0;
        local_20c = 0x10;
        local_47c = local_76c;
        local_47d = 1;
        local_7c0 = 0;
        local_7b0 = 0;
        local_7a8 = 0;
        local_798 = 0;
        local_794 = 0;
        local_790 = 0;
        local_78c = 0;
        local_788 = 0;
        local_780 = 0;
        local_7b8 = 0;
        local_3b0 = &local_810;
        local_2c4 = *(int *)((long)local_510 + 0x2c);
        local_2c8 = (int)local_510[6];
        local_2cc = *(undefined4 *)((long)local_510 + 0x34);
        local_7c8 = *local_510 + local_510[8] * (long)local_76c * local_510[2];
        local_2e0 = local_510[2];
        local_2e4 = (undefined4)local_510[3];
        local_2f0 = local_510[4];
        local_2c0 = &local_810;
        local_1d8 = (long)local_2c4 * (long)local_2c8 * local_2e0;
        local_4c8 = &local_810;
        local_3d0 = &local_810;
        local_1dc = 0x10;
        local_3bc = local_76c;
        local_3bd = 1;
        local_810 = 0;
        local_800 = 0;
        local_7f8 = 0;
        local_7e8 = 0;
        local_7e4 = 0;
        local_7e0 = 0;
        local_7dc = 0;
        local_7d8 = 0;
        local_7d0 = 0;
        local_808 = 0;
        local_2d8 = local_7c8;
        local_230 = local_778;
        local_168 = local_3d0;
        local_148 = local_3e0;
        local_7f0 = local_2f0;
        local_7a0 = local_248;
        for (local_814 = 0; local_814 < local_758; local_814 = local_814 + 1) {
          for (local_818 = 0; local_818 < local_760; local_818 = local_818 + 1) {
            fVar1 = expf(-*(float *)(local_778 + (long)(local_818 + local_760) * 4));
            *(float *)(local_7c8 + (long)local_818 * 4) =
                 *(float *)(local_778 + (long)local_818 * 4) * (1.0 / (fVar1 + 1.0));
          }
          local_778 = local_778 + (long)local_754 * 4;
          local_7c8 = local_7c8 + (long)local_760 * 4;
        }
      }
      local_4f4 = 0;
    }
    else {
      local_4f4 = -100;
    }
  }
  return local_4f4;
}

Assistant:

int GLU::forward(const Mat& bottom_blob, Mat& top_blob,
                 const Option& opt) const
{
    int dims = bottom_blob.dims;
    int positive_axis = axis < 0 ? dims + axis : axis;

    if (dims == 1)
    {   // ignore axis
        int w = bottom_blob.w;
        int out_w = w / 2;
        top_blob.create(out_w, sizeof(float), opt.blob_allocator);

        const float* in_ptr = bottom_blob;
        float* out_ptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int x = 0; x < out_w; ++x)
        {
            float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));

            out_ptr[x] = in_ptr[x] * sigmoid;
        }

        return 0;
    } // if (dims == 1)

    if (dims == 2 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int out_w = w;
        int out_h = h / 2;
        top_blob.create(out_w, out_h, sizeof(float), opt.blob_allocator);

        int offset = out_w * out_h;

#if 0
        // this one is equivalent to the else branch. It is more readable
        // but less efficient
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < out_h; ++y) {
            const float *in_ptr = bottom_blob.row(y);
            float *out_ptr = top_blob.row(y);

            for (int x = 0; x < w; ++x) {
                float sigmoid =
                    1.f / (1.f + expf(-in_ptr[x + offset]));

                out_ptr[x] = in_ptr[x] * sigmoid;
            }
        }
#else
        int size = offset;
        const float* in_ptr = bottom_blob;
        float* out_ptr = top_blob;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; ++i)
        {
            float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
            out_ptr[i] = in_ptr[i] * sigmoid;
        }
#endif

        return 0;
    } // if (dims == 2 && positive_axis == 0)

    if (dims == 2 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int out_w = w / 2;
        int out_h = h;

        top_blob.create(out_w, out_h, sizeof(float), opt.blob_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int y = 0; y < h; ++y)
        {
            const float* in_ptr = bottom_blob.row(y);
            float* out_ptr = top_blob.row(y);

            for (int x = 0; x < out_w; ++x)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));
                out_ptr[x] = in_ptr[x] * sigmoid;
            }
        }

        return 0;
    } // if (dims == 2 && positive_axis == 1)

    if (dims == 3 && positive_axis == 0)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w;
        int out_h = h;
        int out_c = c / 2;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        int offset = out_c * bottom_blob.cstep;
        int size = w * h;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < out_c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);

            for (int i = 0; i < size; ++i)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
                out_ptr[i] = in_ptr[i] * sigmoid;
            }
        }
        return 0;
    } //   if (dims == 3 && positive_axis == 0) {

    if (dims == 3 && positive_axis == 1)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w;
        int out_h = h / 2;
        int out_c = c;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        int offset = out_h * out_w;
        int size = offset;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);

            for (int i = 0; i < size; ++i)
            {
                float sigmoid = 1.f / (1.f + expf(-in_ptr[i + offset]));
                out_ptr[i] = in_ptr[i] * sigmoid;
            }
        }
        return 0;
    } // if (dims == 3 && positive_axis == 1)

    if (dims == 3 && positive_axis == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int c = bottom_blob.c;

        int out_w = w / 2;
        int out_h = h;
        int out_c = c;

        top_blob.create(out_w, out_h, out_c, sizeof(float), opt.blob_allocator);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < c; ++q)
        {
            const float* in_ptr = bottom_blob.channel(q);
            float* out_ptr = top_blob.channel(q);
            for (int y = 0; y < h; ++y)
            {
                for (int x = 0; x < out_w; ++x)
                {
                    float sigmoid = 1.f / (1.f + expf(-in_ptr[x + out_w]));
                    out_ptr[x] = in_ptr[x] * sigmoid;
                }
                in_ptr += w;
                out_ptr += out_w;
            }
        }
        return 0;
    } // if (dims == 3 && positive_axis == 2)

    return -100;
}